

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O0

int __thiscall HttpConn::findCRLF(HttpConn *this,int start)

{
  bool bVar1;
  difference_type dVar2;
  int local_50;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  char *local_38;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> it;
  const_iterator beg;
  int start_local;
  HttpConn *this_local;
  
  it._M_current = (char *)std::vector<char,_std::allocator<char>_>::begin(&this->readBuff_);
  local_30 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator+(&it,(long)start);
  local_38 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
                     operator+(&it,(long)this->read_idx_);
  local_28 = std::
             search<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,char_const*>
                       (local_30,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                  )local_38,"\r\n","");
  local_40._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(&this->readBuff_);
  bVar1 = __gnu_cxx::operator==(&local_28,&local_40);
  if (bVar1) {
    local_50 = -1;
  }
  else {
    dVar2 = __gnu_cxx::operator-(&local_28,&it);
    local_50 = (int)dVar2;
  }
  return local_50;
}

Assistant:

int HttpConn::findCRLF(int start) const {
    auto beg = readBuff_.begin();
    auto it = std::search(beg + start, beg + read_idx_, CRLF, CRLF + 2);
    return it == readBuff_.end() ? -1 : it - beg;
}